

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall cppcms::widgets::text::render_value(text *this,form_context *context)

{
  ostream *poVar1;
  string local_58;
  string local_38;
  
  if (((&(this->super_base_html_input).field_0x1f0)
       [(long)(this->super_base_html_input)._vptr_base_html_input[-3]] & 2) != 0) {
    poVar1 = form_context::out(context);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," value=\"",8);
    base_text::value_abi_cxx11_(&local_38,(base_text *)&(this->super_base_html_input).field_0x30);
    util::escape(&local_58,&local_38);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_58._M_dataplus._M_p,local_58._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void text::render_value(form_context &context)
{
	if(set()) {
		context.out() << " value=\"" << util::escape(value()) << "\"";
	}
}